

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_isBaseUnitDimensionless_Test::TestBody(Units_isBaseUnitDimensionless_Test *this)

{
  char cVar1;
  AssertionResult gtest_ar_;
  UnitsPtr u;
  long *local_60;
  AssertHelper local_58 [8];
  AssertionResult local_50;
  long local_40 [2];
  char local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Units::create();
  local_50._0_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"dimensionless","");
  libcellml::NamedEntity::setName(local_20);
  if ((long *)local_50._0_8_ != local_40) {
    operator_delete((void *)local_50._0_8_,local_40[0] + 1);
  }
  local_30[0] = libcellml::Units::isBaseUnit();
  local_28.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_30[0] == '\0') {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,local_30,"u->isBaseUnit()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x846,(char *)local_50._0_8_);
    testing::internal::AssertHelper::operator=(local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    if ((long *)local_50._0_8_ != local_40) {
      operator_delete((void *)local_50._0_8_,local_40[0] + 1);
    }
    if (local_60 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_60 != (long *)0x0)) {
        (**(code **)(*local_60 + 8))();
      }
      local_60 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Units, isBaseUnitDimensionless)
{
    libcellml::UnitsPtr u = libcellml::Units::create();

    u->setName("dimensionless");

    EXPECT_TRUE(u->isBaseUnit());
}